

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

resource loader::exe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  BinaryType BVar1;
  resource rVar2;
  undefined8 in_RDI;
  BinaryType bintype;
  resource result;
  istream *in_stack_00000038;
  uint32_t in_stack_000000cc;
  uint32_t in_stack_000000d0;
  uint32_t in_stack_000000d4;
  istream *in_stack_000000d8;
  istream *in_stack_fffffffffffffff8;
  
  BVar1 = anon_unknown_0::determine_binary_type(in_stack_00000038);
  if (BVar1 == OS2Magic) {
    rVar2 = anon_unknown_0::ne_reader::find_resource
                      (in_stack_fffffffffffffff8,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI)
    ;
  }
  else if (BVar1 == PEMagic) {
    rVar2 = anon_unknown_0::pe_reader::find_resource
                      (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc);
  }
  else {
    rVar2.offset = 0;
    rVar2.size = 0;
  }
  return rVar2;
}

Assistant:

exe_reader::resource exe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                               boost::uint32_t type,
                                               boost::uint32_t language) {
	
	BinaryType bintype = determine_binary_type(is);
	switch(bintype) {
		case OS2Magic: return ne_reader::find_resource(is, name, type);
		case PEMagic:  return pe_reader::find_resource(is, name, type, language);
		default: {
			resource result;
			result.offset = result.size = 0;
			return result;
		}
	}
	
}